

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

bool __thiscall QTabBar::event(QTabBar *this,QEvent *event)

{
  undefined1 *rect;
  ushort uVar1;
  QTabBarPrivate *this_00;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  ulong uVar7;
  Tab *pTVar8;
  QStyle *pQVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QRect QVar19;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x6e) {
    if (uVar1 < 0x3c) {
      if ((uVar1 - 2 < 2) || (uVar1 == 5)) {
        uVar6 = QEventPoint::position();
        auVar15._0_8_ =
             (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa_00;
        auVar15._8_8_ =
             (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa_00;
        auVar13 = minpd(_DAT_0066f5d0,auVar15);
        auVar16._8_8_ = -(ulong)(-2147483648.0 < auVar13._8_8_);
        auVar16._0_8_ = -(ulong)(-2147483648.0 < auVar13._0_8_);
        uVar4 = movmskpd(uVar6,auVar16);
        uVar11 = 0x8000000000000000;
        if ((uVar4 & 1) != 0) {
          uVar11 = (ulong)(uint)(int)auVar13._0_8_ << 0x20;
        }
        uVar7 = 0x80000000;
        if ((uVar4 & 2) != 0) {
          uVar7 = (ulong)(uint)(int)auVar13._8_8_;
        }
        this_00->mousePosition = (QPoint)(uVar7 | uVar11);
        (this_00->mouseButtons).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
        super_QFlagsStorage<Qt::MouseButton>.i = *(Int *)(event + 0x44);
      }
    }
    else if (uVar1 - 0x3e < 2) {
      QBasicTimer::stop();
      this_00->switchTabCurrentIndex = -1;
LAB_004958e8:
      event[0xc] = (QEvent)0x0;
    }
    else if (uVar1 == 0x3c) {
      if ((this_00->field_0x2d1 & 0x10) != 0) {
        event[0xc] = (QEvent)0x1;
      }
    }
    else if ((uVar1 == 0x3d) && ((this_00->field_0x2d1 & 0x10) != 0)) {
      auVar17._0_8_ =
           (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x10);
      auVar17._8_8_ =
           (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x18);
      auVar13 = minpd(_DAT_0066f5d0,auVar17);
      auVar18._8_8_ = -(ulong)(-2147483648.0 < auVar13._8_8_);
      auVar18._0_8_ = -(ulong)(-2147483648.0 < auVar13._0_8_);
      uVar4 = movmskpd(0x3d,auVar18);
      uVar11 = 0x8000000000000000;
      if ((uVar4 & 2) != 0) {
        uVar11 = (ulong)(uint)(int)auVar13._8_8_ << 0x20;
      }
      local_48._0_8_ = 0x80000000;
      if ((uVar4 & 1) != 0) {
        local_48._0_8_ = (ulong)(uint)(int)auVar13._0_8_;
      }
      local_48._0_8_ = local_48._0_8_ | uVar11;
      iVar5 = tabAt(this,(QPoint *)&local_48);
      lVar10 = *(long *)&(this->super_QWidget).field_0x8;
      if ((ulong)(long)iVar5 < *(ulong *)(lVar10 + 0x2e8)) {
        lVar10 = *(long *)(*(long *)(lVar10 + 0x2e0) + (long)iVar5 * 8);
      }
      else {
        lVar10 = 0;
      }
      if (((lVar10 != 0) && ((*(byte *)(lVar10 + 0xe4) & 1) != 0)) &&
         (this_00->switchTabCurrentIndex != iVar5)) {
        this_00->switchTabCurrentIndex = iVar5;
        pQVar9 = QWidget::style(&this->super_QWidget);
        iVar5 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x68,0,this,0);
        QBasicTimer::start(&this_00->switchTabTimer,(long)iVar5 * 1000000,1,this);
      }
      goto LAB_004958e8;
    }
  }
  else {
    if (0x7a < uVar1) {
      switch(uVar1) {
      case 0x7b:
        iVar5 = QTabBarPrivate::indexAtPos(this_00,(QPoint *)(event + 0x10));
        if ((ulong)(long)iVar5 < (ulong)(this_00->tabList).d.size) {
          pTVar8 = (this_00->tabList).d.ptr[iVar5];
        }
        else {
          pTVar8 = (Tab *)0x0;
        }
        if ((pTVar8 != (Tab *)0x0) && (bVar3 = true, (pTVar8->whatsThis).d.size != 0))
        goto LAB_00495a89;
        event[0xc] = (QEvent)0x0;
        break;
      default:
        goto switchD_004956d6_caseD_7c;
      case 0x7f:
      case 0x81:
        uVar6 = QEventPoint::position();
        auVar13._0_8_ =
             (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
        auVar13._8_8_ =
             (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa;
        auVar13 = minpd(_DAT_0066f5d0,auVar13);
        auVar14._8_8_ = -(ulong)(-2147483648.0 < auVar13._8_8_);
        auVar14._0_8_ = -(ulong)(-2147483648.0 < auVar13._0_8_);
        uVar4 = movmskpd(uVar6,auVar14);
        uVar11 = 0x8000000000000000;
        if ((uVar4 & 1) != 0) {
          uVar11 = (ulong)(uint)(int)auVar13._0_8_ << 0x20;
        }
        uVar7 = 0x80000000;
        if ((uVar4 & 2) != 0) {
          uVar7 = (ulong)(uint)(int)auVar13._8_8_;
        }
        this_00->mousePosition = (QPoint)(uVar7 | uVar11);
        rect = &(this_00->super_QWidgetPrivate).field_0x254;
        cVar2 = QRect::contains((QPoint *)rect,SUB81(&this_00->mousePosition,0));
        bVar3 = true;
        if (cVar2 == '\0') {
          if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c
              ) && (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
            QWidget::update(&this->super_QWidget,(QRect *)rect);
          }
          uVar4 = tabAt(this,&this_00->mousePosition);
          this_00->hoverIndex = uVar4;
          if (((int)uVar4 < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)uVar4)) {
            *(undefined8 *)rect = 0;
            *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
          }
          else {
            QVar19 = tabRect(this,uVar4);
            *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar19;
            QWidget::update(&this->super_QWidget,(QRect *)rect);
          }
        }
        goto LAB_00495a89;
      case 0x80:
        (this_00->mousePosition).xp = -1;
        (this_00->mousePosition).yp = -1;
        if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c)
           && (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
          QWidget::update(&this->super_QWidget,(QRect *)&(this_00->super_QWidgetPrivate).field_0x254
                         );
        }
        this_00->hoverIndex = -1;
        *(undefined8 *)&(this_00->super_QWidgetPrivate).field_0x254 = 0;
        *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
        (this_00->accumulatedAngleDelta).xp = 0;
        (this_00->accumulatedAngleDelta).yp = 0;
      }
LAB_00495a86:
      bVar3 = true;
      goto LAB_00495a89;
    }
    if (uVar1 == 0x6e) {
      iVar5 = tabAt(this,(QPoint *)(event + 0x10));
      if ((ulong)(long)iVar5 < (ulong)(this_00->tabList).d.size) {
        pTVar8 = (this_00->tabList).d.ptr[iVar5];
      }
      else {
        pTVar8 = (Tab *)0x0;
      }
      if ((pTVar8 != (Tab *)0x0) && ((pTVar8->toolTip).d.size != 0)) {
        local_48.x1.m_i = 0;
        local_48.y1.m_i = 0;
        local_48.x2.m_i = -1;
        local_48.y2.m_i = -1;
        QToolTip::showText((QPoint *)(event + 0x18),&pTVar8->toolTip,&this->super_QWidget,&local_48,
                           -1);
        goto LAB_00495a86;
      }
    }
    else if (uVar1 == 0x6f) {
      iVar5 = QTabBarPrivate::indexAtPos(this_00,(QPoint *)(event + 0x10));
      if ((ulong)(long)iVar5 < (ulong)(this_00->tabList).d.size) {
        pTVar8 = (this_00->tabList).d.ptr[iVar5];
      }
      else {
        pTVar8 = (Tab *)0x0;
      }
      if ((pTVar8 != (Tab *)0x0) && ((pTVar8->whatsThis).d.size != 0)) {
        QWhatsThis::showText((QPoint *)(event + 0x18),&pTVar8->whatsThis,&this->super_QWidget);
        goto LAB_00495a86;
      }
    }
    else if ((uVar1 == 0x75) && (lVar10 = (this_00->tabList).d.size, lVar10 != 0)) {
      lVar12 = 0;
      do {
        if ((this_00->tabList).d.ptr[lVar12]->shortcutId == *(int *)(event + 0x18)) {
          setCurrentIndex(this,(int)lVar12);
          goto LAB_00495a86;
        }
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
  }
switchD_004956d6_caseD_7c:
  bVar3 = QWidget::event(&this->super_QWidget,event);
LAB_00495a89:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTabBar::event(QEvent *event)
{
    Q_D(QTabBar);
    switch (event->type()) {
    case QEvent::HoverMove:
    case QEvent::HoverEnter: {
        QHoverEvent *he = static_cast<QHoverEvent *>(event);
        d->mousePosition = he->position().toPoint();
        if (!d->hoverRect.contains(d->mousePosition)) {
            if (d->hoverRect.isValid())
                update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        return true;
    }
    case QEvent::HoverLeave: {
        d->mousePosition = {-1, -1};
        if (d->hoverRect.isValid())
            update(d->hoverRect);
        d->hoverIndex = -1;
        d->hoverRect = QRect();
#if QT_CONFIG(wheelevent)
        d->accumulatedAngleDelta = QPoint();
#endif
        return true;
    }
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        if (const QTabBarPrivate::Tab *tab = d->at(tabAt(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->toolTip.isEmpty()) {
                QToolTip::showText(static_cast<QHelpEvent*>(event)->globalPos(), tab->toolTip, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(tooltip)
#if QT_CONFIG(whatsthis)
    case QEvent::QEvent::QueryWhatsThis: {
        const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()));
        if (!tab || tab->whatsThis.isEmpty())
            event->ignore();
        return true;
    }
    case QEvent::WhatsThis:
        if (const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->whatsThis.isEmpty()) {
                QWhatsThis::showText(static_cast<QHelpEvent*>(event)->globalPos(),
                                     tab->whatsThis, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(whatsthis)
#ifndef QT_NO_SHORTCUT

    case QEvent::Shortcut: {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(event);
        for (int i = 0; i < d->tabList.size(); ++i) {
            const QTabBarPrivate::Tab *tab = d->tabList.at(i);
            if (tab->shortcutId == se->shortcutId()) {
                setCurrentIndex(i);
                return true;
            }
        }
    }
        break;
#endif
    case QEvent::Move:
        d->updateMacBorderMetrics();
        break;
#if QT_CONFIG(draganddrop)

    case QEvent::DragEnter:
        if (d->changeCurrentOnDrag)
            event->accept();
        break;
    case QEvent::DragMove:
        if (d->changeCurrentOnDrag) {
            const int tabIndex = tabAt(static_cast<QDragMoveEvent *>(event)->position().toPoint());
            if (isTabEnabled(tabIndex) && d->switchTabCurrentIndex != tabIndex) {
                d->switchTabCurrentIndex = tabIndex;
                d->switchTabTimer.start(
                    style()->styleHint(QStyle::SH_TabBar_ChangeCurrentDelay, nullptr, this) * 1ms, this);
            }
            event->ignore();
        }
        break;
    case QEvent::DragLeave:
    case QEvent::Drop:
        d->killSwitchTabTimer();
        event->ignore();
        break;
#endif
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        d->mousePosition = static_cast<QMouseEvent *>(event)->position().toPoint();
        d->mouseButtons = static_cast<QMouseEvent *>(event)->buttons();
        break;
    default:
        break;
    }

    return QWidget::event(event);
}